

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  long lVar5;
  pointer pfVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer piVar8;
  pointer piVar9;
  Model *pMVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  time_point tVar12;
  ulong uVar13;
  invalid_argument *this_00;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  shared_ptr<fasttext::DenseMatrix> ninput;
  shared_ptr<fasttext::DenseMatrix> input;
  shared_ptr<fasttext::DenseMatrix> output;
  shared_ptr<fasttext::Loss> loss_1;
  bool local_9a;
  undefined1 local_99;
  vector<int,_std::allocator<int>_> local_98;
  Model *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  __shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> local_58;
  __atomic_base<long> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  time_point local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->model == sup) {
    std::__cxx11::string::_M_assign((string *)&peVar3->input);
    peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3->qout = qargs->qout;
    std::__cxx11::string::_M_assign((string *)&peVar3->output);
    peVar4 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      local_68._M_ptr = (element_type *)0x0;
    }
    else {
      local_68._M_ptr =
           (element_type *)__dynamic_cast(peVar4,&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
    }
    if (local_68._M_ptr == (element_type *)0x0) {
      local_68 = (__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>)
                 (ZEXT816(0) << 0x40);
    }
    else {
      local_68._M_refcount._M_pi =
           (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_68._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68._M_refcount._M_pi)->_M_use_count =
               (local_68._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68._M_refcount._M_pi)->_M_use_count =
               (local_68._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
    }
    peVar4 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (peVar4 == (element_type *)0x0) {
      local_58._M_ptr = (element_type *)0x0;
    }
    else {
      local_58._M_ptr =
           (element_type *)__dynamic_cast(peVar4,&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
    }
    if (local_58._M_ptr == (element_type *)0x0) {
      local_58 = (__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>)
                 (ZEXT816(0) << 0x40);
    }
    else {
      local_58._M_refcount._M_pi =
           (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_58._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58._M_refcount._M_pi)->_M_use_count =
               (local_58._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58._M_refcount._M_pi)->_M_use_count =
               (local_58._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
    }
    local_9a = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->model == sup;
    uVar17 = qargs->cutoff;
    if (uVar17 != 0) {
      uVar13 = Matrix::size(&(local_68._M_ptr)->super_Matrix,0);
      if (uVar17 < uVar13) {
        selectEmbeddings(&local_98,this,(int32_t)qargs->cutoff);
        Dictionary::prune((this->dict_).
                          super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&local_98);
        local_48._M_i =
             (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
        local_78 = (Model *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<fasttext::DenseMatrix,std::allocator<fasttext::DenseMatrix>,unsigned_long,int&>
                  (&_Stack_70,(DenseMatrix **)&local_78,
                   (allocator<fasttext::DenseMatrix> *)&stack0xffffffffffffffc8,
                   (unsigned_long *)&stack0xffffffffffffffb8,
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->dim);
        if ((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar14 = (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->dim;
          lVar15 = 0;
          lVar16 = 0;
          do {
            if (0 < (int)uVar1) {
              iVar2 = *(int *)((long)&(((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_98.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->_M_h).
                                      _M_buckets + lVar16 * 4);
              lVar5 = ((local_68._M_ptr)->super_Matrix).n_;
              pfVar6 = ((local_68._M_ptr)->data_).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              peVar4 = (local_78->wo_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var7 = (local_78->wo_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              uVar17 = 0;
              do {
                *(float *)((long)&p_Var7->_vptr__Sp_counted_base +
                          uVar17 * 4 + (long)peVar4 * lVar15) = pfVar6[iVar2 * lVar5 + uVar17];
                uVar17 = uVar17 + 1;
              } while (uVar1 != uVar17);
            }
            lVar16 = lVar16 + 1;
            lVar15 = lVar15 + 4;
          } while (lVar16 != lVar14 + (ulong)(lVar14 == 0));
        }
        local_68._M_ptr = (element_type *)local_78;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_68._M_refcount,&_Stack_70)
        ;
        if (qargs->retrain != false) {
          peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          peVar3->epoch = qargs->epoch;
          peVar3->lr = qargs->lr;
          peVar3->thread = qargs->thread;
          peVar3->verbose = qargs->verbose;
          createLoss((FastText *)&stack0xffffffffffffffb8,(shared_ptr<fasttext::Matrix> *)this);
          local_38.__d.__r = (duration)0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
                    (&stack0xffffffffffffffd0,(Model **)&stack0xffffffffffffffc8,
                     (allocator<fasttext::Model> *)&local_99,
                     (shared_ptr<fasttext::DenseMatrix> *)&local_68,
                     (shared_ptr<fasttext::DenseMatrix> *)&local_58,
                     (shared_ptr<fasttext::Loss> *)&stack0xffffffffffffffb8,&local_9a);
          _Var11._M_pi = _Stack_30._M_pi;
          tVar12.__d.__r = local_38.__d.__r;
          local_38.__d.__r = (duration)0;
          _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var7 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)tVar12.__d.__r;
          (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = _Var11._M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
          }
          startThreads(this);
          if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
          }
        }
        if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
        }
        if ((element_type *)
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (element_type *)0x0) {
          operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::QuantMatrix,std::allocator<fasttext::QuantMatrix>,fasttext::DenseMatrix,unsigned_long_const&,bool_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,(QuantMatrix **)&local_98,
               (allocator<fasttext::QuantMatrix> *)&local_78,local_68._M_ptr,&qargs->dsub,
               &qargs->qnorm);
    piVar9 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    piVar8 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    p_Var7 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)piVar8;
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)piVar9;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true) {
      local_78 = (Model *)CONCAT44(local_78._4_4_,2);
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<fasttext::QuantMatrix,std::allocator<fasttext::QuantMatrix>,fasttext::DenseMatrix,int,bool_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,(QuantMatrix **)&local_98,
                 (allocator<fasttext::QuantMatrix> *)&stack0xffffffffffffffb8,local_58._M_ptr,
                 (int *)&local_78,&qargs->qnorm);
      piVar9 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar8 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      p_Var7 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)piVar8;
      (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)piVar9;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
    }
    this->quant_ = true;
    createLoss((FastText *)&local_98,(shared_ptr<fasttext::Matrix> *)this);
    local_78 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
              (&_Stack_70,&local_78,(allocator<fasttext::Model> *)&stack0xffffffffffffffb8,
               &this->input_,&this->output_,(shared_ptr<fasttext::Loss> *)&local_98,&local_9a);
    _Var11._M_pi = _Stack_70._M_pi;
    pMVar10 = local_78;
    local_78 = (Model *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var7 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pMVar10;
    (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var11._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    if (local_58._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_refcount._M_pi);
    }
    if (local_68._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_refcount._M_pi);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"For now we only support quantization of supervised models");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::quantize(const Args& qargs) {
  if (args_->model != model_name::sup) {
    throw std::invalid_argument(
        "For now we only support quantization of supervised models");
  }
  args_->input = qargs.input;
  args_->qout = qargs.qout;
  args_->output = qargs.output;
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  std::shared_ptr<DenseMatrix> output =
      std::dynamic_pointer_cast<DenseMatrix>(output_);
  bool normalizeGradient = (args_->model == model_name::sup);

  if (qargs.cutoff > 0 && qargs.cutoff < input->size(0)) {
    auto idx = selectEmbeddings(qargs.cutoff);
    dict_->prune(idx);
    std::shared_ptr<DenseMatrix> ninput =
        std::make_shared<DenseMatrix>(idx.size(), args_->dim);
    for (auto i = 0; i < idx.size(); i++) {
      for (auto j = 0; j < args_->dim; j++) {
        ninput->at(i, j) = input->at(idx[i], j);
      }
    }
    input = ninput;
    if (qargs.retrain) {
      args_->epoch = qargs.epoch;
      args_->lr = qargs.lr;
      args_->thread = qargs.thread;
      args_->verbose = qargs.verbose;
      auto loss = createLoss(output_);
      model_ = std::make_shared<Model>(input, output, loss, normalizeGradient);
      startThreads();
    }
  }

  input_ = std::make_shared<QuantMatrix>(
      std::move(*(input.get())), qargs.dsub, qargs.qnorm);

  if (args_->qout) {
    output_ = std::make_shared<QuantMatrix>(
        std::move(*(output.get())), 2, qargs.qnorm);
  }

  quant_ = true;
  auto loss = createLoss(output_);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
}